

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

uint32_t __thiscall Buffer::CopyOut(Buffer *this,char *out,uint32_t l)

{
  BufferChain *pBVar1;
  uint16_t uVar2;
  char *pcVar3;
  BufferChain *tmp;
  BufferChain *pBStack_30;
  uint16_t canReadCount;
  BufferChain *buff;
  uint32_t ret;
  uint32_t l_local;
  char *out_local;
  Buffer *this_local;
  
  buff._0_4_ = 0;
  pBStack_30 = this->m_head;
  buff._4_4_ = l;
  while( true ) {
    while( true ) {
      if (pBStack_30 == (BufferChain *)0x0) {
        return (uint32_t)buff;
      }
      uVar2 = BufferChain::GetCanReadCount(pBStack_30);
      if (uVar2 != 0) break;
      pBVar1 = pBStack_30->nextpkt;
      (*this->_vptr_Buffer[1])(this,pBStack_30);
      this->m_head = pBVar1;
      pBStack_30 = pBVar1;
      if (this->m_head == (BufferChain *)0x0) {
        this->m_end = (BufferChain *)0x0;
      }
    }
    if (buff._4_4_ < uVar2) break;
    pcVar3 = BufferChain::GetReadAddr(pBStack_30);
    memcpy(out + (uint32_t)buff,pcVar3,(ulong)uVar2);
    buff._0_4_ = uVar2 + (uint32_t)buff;
    buff._4_4_ = buff._4_4_ - uVar2;
    if (buff._4_4_ == 0) {
      return (uint32_t)buff;
    }
    pBStack_30 = pBStack_30->nextpkt;
  }
  pcVar3 = BufferChain::GetReadAddr(pBStack_30);
  memcpy(out + (uint32_t)buff,pcVar3,(ulong)buff._4_4_);
  return buff._4_4_ + (uint32_t)buff;
}

Assistant:

uint32_t Buffer::CopyOut(char* out, uint32_t l)
{
    uint32_t ret = 0;
    for(BufferChain* buff = m_head; buff != nullptr; )
    {
        uint16_t canReadCount = buff->GetCanReadCount();
        if(canReadCount == 0)
        {
            BufferChain* tmp = buff->nextpkt;
            Cycle(buff);
            buff = tmp;
            m_head = buff;
            if(m_head == nullptr)
                m_end = nullptr;
        }
        else
        {
            if(l < canReadCount)
            {
                memcpy(out + ret, buff->GetReadAddr(), l);
                ret += l;
                return ret;
            }
            else
            {
                memcpy(out + ret, buff->GetReadAddr(), canReadCount);
                ret += canReadCount;
                l -= canReadCount;

                if(l == 0)
                    return ret;

                buff = buff->nextpkt;
            }
        }
    }
    return ret;
}